

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int entries;
  uint64_t phys_pages [256];
  uint32_t lo;
  uint32_t hi;
  _func_int_uint64_t_int_uint64_t_ptr *physpages_from_pt;
  _func_int_uint64_t_uint64_t_ptr_int_ptr *pte_from_pde;
  int ret;
  int hostmem;
  uint64_t pte;
  uint64_t chan_ptr;
  uint32_t boot0;
  uint32_t tmp_reg;
  int j;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  tmp_reg = 0;
  boot0 = 0;
  phys_pages[0xff]._4_4_ = 0;
  phys_pages[0xff]._0_4_ = 0;
  _j = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    for (tmp_reg = 0; (int)tmp_reg < (int)argv_local; tmp_reg = tmp_reg + 1) {
      iVar1 = strcmp("--help",_j[(int)tmp_reg]);
      if (iVar1 == 0) {
        help();
        return 0;
      }
    }
    uVar2 = peek(0);
    chan_ptr._0_4_ = (int)(uVar2 & 0x1ff00000) >> 0x14;
    if (((uint)chan_ptr < 0xa3) || (0xff < (uint)chan_ptr)) {
      fprintf(_stderr,"Card unsupported.\n");
      argv_local._4_4_ = -1;
      iVar1 = argv_local._4_4_;
    }
    else {
      if ((uint)chan_ptr < 0xc0) {
        physpages_from_pt = g80_pte_from_pde;
        _lo = g80_physpages_from_pt;
      }
      else {
        physpages_from_pt = gf100_pte_from_pde;
        _lo = gf100_physpages_from_pt;
      }
      uVar2 = peek(0x10a110);
      chan_ptr._4_4_ = uVar2 & 0xffffff00;
      if ((uVar2 & 0x7ff00) == 0x7ff00) {
        chan_ptr._4_4_ = peek(0x10a47c);
        if ((chan_ptr._4_4_ & 0xf0000000) == 0x70000000) {
          pte = ((ulong)chan_ptr._4_4_ & 0xfffffff) << 0xc;
          pte_from_pde._0_4_ =
               (*physpages_from_pt)(pte,(int)&ret,(uint64_t *)((long)&pte_from_pde + 4));
          iVar1 = (int)pte_from_pde;
          if ((int)pte_from_pde == 0) {
            iVar1 = (*_lo)(_ret,pte_from_pde._4_4_,&stack0xfffffffffffff7a8);
            for (tmp_reg = 0; (int)tmp_reg < iVar1; tmp_reg = tmp_reg + 1) {
              phys_pages[0xff]._4_4_ =
                   (uint)((ulong)*(undefined8 *)(&stack0xfffffffffffff7a8 + (long)(int)tmp_reg * 8)
                         >> 0x10) & 0xffffff;
              phys_pages[0xff]._0_4_ =
                   (uint)*(undefined8 *)(&stack0xfffffffffffff7a8 + (long)(int)tmp_reg * 8) & 0xffff
              ;
              poke(0x1700,phys_pages[0xff]._4_4_ | 0x2000000);
              for (boot0 = 0; (int)boot0 < 0x1000; boot0 = boot0 + 4) {
                chan_ptr._4_4_ = peek((uint)phys_pages[0xff] + 0x700000 + boot0);
                printf("%c%c%c%c",(ulong)chan_ptr._4_4_,(ulong)(chan_ptr._4_4_ >> 8),
                       (ulong)(chan_ptr._4_4_ >> 0x10),(ulong)(chan_ptr._4_4_ >> 0x18));
              }
            }
            argv_local._4_4_ = 0;
            iVar1 = argv_local._4_4_;
          }
        }
        else {
          fprintf(_stderr,"Channel not set up\n");
          argv_local._4_4_ = -1;
          iVar1 = argv_local._4_4_;
        }
      }
      else {
        fprintf(_stderr,"Register 0x10a110 not in order\n");
        argv_local._4_4_ = -1;
        iVar1 = argv_local._4_4_;
      }
    }
  }
  else {
    printf("Init failed\n");
    argv_local._4_4_ = -1;
    iVar1 = argv_local._4_4_;
  }
  argv_local._4_4_ = iVar1;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	int i = 0, j = 0;
	uint32_t tmp_reg;
	uint32_t boot0;
	uint64_t chan_ptr, pte;
	int hostmem;
	int ret;

	int (*pte_from_pde)(uint64_t, uint64_t *, int *);
	int (*physpages_from_pt)(uint64_t, int , uint64_t *);

	uint32_t hi = 0,lo = 0;
	uint64_t phys_pages[256];
	int entries = 0;

	if (nva_init()) {
		printf("Init failed\n");
		return -1;
	}

	for (i = 0; i < argc; i++) {
		if(strcmp("--help",argv[i]) == 0) {
			help();
			return 0;
		}
	}

	// Check card generation
	boot0 = (peek(0x0) & 0x1ff00000) >> 20;
	if (boot0 < 0xa3 || boot0 >= 0x100){
		fprintf(stderr,"Card unsupported.\n");
		return -1;
	} else if (boot0 < 0xc0) {
		pte_from_pde = g80_pte_from_pde;
		physpages_from_pt = g80_physpages_from_pt;
	} else {
		pte_from_pde = gf100_pte_from_pde;
		physpages_from_pt = gf100_physpages_from_pt;
	}

	// First checking xfer-ext base to see if the fuc code was uploaded
	tmp_reg = peek(0x10a110);
	tmp_reg = tmp_reg & 0xffffff00;
	if ((tmp_reg & 0x0007ff00) != 0x0007ff00) {
		fprintf(stderr,"Register 0x10a110 not in order\n");
		return -1;
	}

	// Is channel set up?
	tmp_reg = peek(0x10a47c);
	if ((tmp_reg  & 0xf0000000) != 0x70000000) {
		fprintf(stderr,"Channel not set up\n");
		return -1;
	}

	// Find the pagetable based on this info
	chan_ptr = ((tmp_reg & 0x0fffffffull) << 12ull) &
			0x000000ffffffffffull; // XXX: Mask?
	ret = pte_from_pde(chan_ptr, &pte, &hostmem);

	if (ret)
		return ret;

	entries = physpages_from_pt(pte, hostmem, phys_pages);

	// And output the fuc codes
	for (i = 0; i < entries; i++) {
		hi = (phys_pages[i] & 0xffffff0000ull) >> 16ull;
		lo = phys_pages[i] & 0x0000ffff;
		poke(0x1700, hi | 0x2000000);

		// Read 4K from here and output this
		for (j = 0; j < 4096; j=j+4) {
			tmp_reg = peek(0x700000+lo+j);
			printf("%c%c%c%c",tmp_reg, tmp_reg>>8, tmp_reg>>16,
					tmp_reg>>24);
		}
	}

	return 0;
}